

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O2

void Dau_DsdWriteVar(Dau_Dsd_t *p,int iVar,int fInv)

{
  char cVar1;
  int iVar2;
  char (*pacVar3) [8];
  
  if (fInv != 0) {
    iVar2 = p->nPos;
    p->nPos = iVar2 + 1;
    p->pOutput[iVar2] = '!';
  }
  pacVar3 = p->pVarDefs + iVar;
  while( true ) {
    cVar1 = (*pacVar3)[0];
    iVar2 = (int)cVar1;
    if (cVar1 == '\0') break;
    if ((iVar2 < p->nVarsInit + 0x61) || (p->nVarsUsed + 0x61 <= iVar2)) {
      iVar2 = p->nPos;
      p->nPos = iVar2 + 1;
      p->pOutput[iVar2] = cVar1;
    }
    else {
      Dau_DsdWriteVar(p,iVar2 + -0x61,0);
    }
    pacVar3 = (char (*) [8])(*pacVar3 + 1);
  }
  return;
}

Assistant:

static inline void Dau_DsdWriteVar( Dau_Dsd_t * p, int iVar, int fInv )
{
    char * pStr;
    if ( fInv )
        p->pOutput[ p->nPos++ ] = '!';
    for ( pStr = p->pVarDefs[iVar]; *pStr; pStr++ )
        if ( *pStr >= 'a' + p->nVarsInit && *pStr < 'a' + p->nVarsUsed )
            Dau_DsdWriteVar( p, *pStr - 'a', 0 );
        else
            p->pOutput[ p->nPos++ ] = *pStr;
}